

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnVehicleSpawn
          (RenX_LoggingPlugin *this,Server *server,TeamType *team,string_view vehicle)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TeamType TVar4;
  undefined1 auVar5 [16];
  string msg;
  long *local_68;
  long local_60;
  long local_58 [2];
  code *local_48;
  size_t local_40;
  char *local_38;
  
  local_38 = vehicle._M_str;
  local_40 = vehicle._M_len;
  if ((*(ulong *)&this->field_0xa0 >> 0x23 & 1) == 0) {
    local_48 = RenX::Server::sendAdmChan;
  }
  else {
    local_48 = RenX::Server::sendLogChan;
  }
  local_68 = local_58;
  pcVar1 = (this->vehicleSpawnFmt)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (this->vehicleSpawnFmt)._M_string_length);
  if (local_60 != 0) {
    TVar4 = RenX::getEnemy(*team);
    RenX::processTags((string *)&local_68,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3a8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x3b0);
    auVar5 = RenX::getTeamColor(*team);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0x3c8);
    uVar3 = *(undefined8 *)(RenX::tags + 0x3d0);
    auVar5 = RenX::getTeamName(*team);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 1000);
    uVar3 = *(undefined8 *)(RenX::tags + 0x3f0);
    auVar5 = RenX::getFullTeamName(*team);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar5 = RenX::getTeamColor(TVar4);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar5 = RenX::getTeamName(TVar4);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar3 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar5 = RenX::getFullTeamName(TVar4);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    uVar2 = *(undefined8 *)(RenX::tags + 0x328);
    uVar3 = *(undefined8 *)(RenX::tags + 0x330);
    auVar5 = RenX::translateName(local_40,local_38);
    RenX::replace_tag(&local_68,uVar3,uVar2,auVar5._0_8_,auVar5._8_8_);
    (*local_48)(server,local_60,local_68);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnVehicleSpawn(RenX::Server &server, const RenX::TeamType &team, std::string_view vehicle)
{
	logFuncType func;
	if (RenX_LoggingPlugin::vehicleSpawnPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->vehicleSpawnFmt;
	if (!msg.empty())
	{
		RenX::TeamType otherTeam = RenX::getEnemy(team);
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(otherTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VEHICLE_TAG, RenX::translateName(vehicle));
		(server.*func)(msg);
	}
}